

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O3

void __thiscall amrex::StateData::swapTimeLevels(StateData *this,Real dt)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Real RVar4;
  TimeCenter TVar5;
  undefined1 auVar6 [16];
  
  RVar4 = (this->new_time).stop;
  (this->old_time).start = (this->new_time).start;
  (this->old_time).stop = RVar4;
  TVar5 = StateDescriptor::timeType(this->desc);
  if (TVar5 == Point) {
    (this->new_time).start = (this->new_time).start + dt;
    dVar1 = (this->new_time).stop;
  }
  else {
    dVar1 = (this->new_time).stop;
    (this->new_time).start = dVar1;
  }
  (this->new_time).stop = dVar1 + dt;
  uVar2 = this->new_data;
  uVar3 = this->old_data;
  auVar6._8_4_ = (int)uVar2;
  auVar6._0_8_ = uVar3;
  auVar6._12_4_ = (int)((ulong)uVar2 >> 0x20);
  this->new_data = (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)uVar3;
  this->old_data = (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)auVar6._8_8_;
  return;
}

Assistant:

void
StateData::swapTimeLevels (Real dt)
{
    old_time = new_time;
    if (desc->timeType() == StateDescriptor::Point)
    {
        new_time.start += dt;
        new_time.stop  += dt;
   }
    else
    {
        new_time.start = new_time.stop;
        new_time.stop += dt;
    }
    std::swap(old_data, new_data);
}